

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000165560 = 0x2e2e2e2e2e2e2e;
    uRam0000000000165567._0_1_ = '.';
    uRam0000000000165567._1_1_ = '.';
    uRam0000000000165567._2_1_ = '.';
    uRam0000000000165567._3_1_ = '.';
    uRam0000000000165567._4_1_ = '.';
    uRam0000000000165567._5_1_ = '.';
    uRam0000000000165567._6_1_ = '.';
    uRam0000000000165567._7_1_ = '.';
    DAT_00165550 = '.';
    DAT_00165550_1._0_1_ = '.';
    DAT_00165550_1._1_1_ = '.';
    DAT_00165550_1._2_1_ = '.';
    DAT_00165550_1._3_1_ = '.';
    DAT_00165550_1._4_1_ = '.';
    DAT_00165550_1._5_1_ = '.';
    DAT_00165550_1._6_1_ = '.';
    uRam0000000000165558 = 0x2e2e2e2e2e2e2e;
    DAT_0016555f = 0x2e;
    DAT_00165540 = '.';
    DAT_00165540_1._0_1_ = '.';
    DAT_00165540_1._1_1_ = '.';
    DAT_00165540_1._2_1_ = '.';
    DAT_00165540_1._3_1_ = '.';
    DAT_00165540_1._4_1_ = '.';
    DAT_00165540_1._5_1_ = '.';
    DAT_00165540_1._6_1_ = '.';
    uRam0000000000165548._0_1_ = '.';
    uRam0000000000165548._1_1_ = '.';
    uRam0000000000165548._2_1_ = '.';
    uRam0000000000165548._3_1_ = '.';
    uRam0000000000165548._4_1_ = '.';
    uRam0000000000165548._5_1_ = '.';
    uRam0000000000165548._6_1_ = '.';
    uRam0000000000165548._7_1_ = '.';
    DAT_00165530 = '.';
    DAT_00165530_1._0_1_ = '.';
    DAT_00165530_1._1_1_ = '.';
    DAT_00165530_1._2_1_ = '.';
    DAT_00165530_1._3_1_ = '.';
    DAT_00165530_1._4_1_ = '.';
    DAT_00165530_1._5_1_ = '.';
    DAT_00165530_1._6_1_ = '.';
    uRam0000000000165538._0_1_ = '.';
    uRam0000000000165538._1_1_ = '.';
    uRam0000000000165538._2_1_ = '.';
    uRam0000000000165538._3_1_ = '.';
    uRam0000000000165538._4_1_ = '.';
    uRam0000000000165538._5_1_ = '.';
    uRam0000000000165538._6_1_ = '.';
    uRam0000000000165538._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000165528._0_1_ = '.';
    uRam0000000000165528._1_1_ = '.';
    uRam0000000000165528._2_1_ = '.';
    uRam0000000000165528._3_1_ = '.';
    uRam0000000000165528._4_1_ = '.';
    uRam0000000000165528._5_1_ = '.';
    uRam0000000000165528._6_1_ = '.';
    uRam0000000000165528._7_1_ = '.';
    DAT_0016556f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }